

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::getResultingAccessChainType(Builder *this)

{
  bool bVar1;
  Id typeId_00;
  uint member;
  size_type sVar2;
  const_reference pvVar3;
  int local_18;
  Id local_14;
  int i;
  Id typeId;
  Builder *this_local;
  
  if ((this->accessChain).base == 0) {
    __assert_fail("accessChain.base != NoResult",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x5b8,"Id spv::Builder::getResultingAccessChainType() const");
  }
  typeId_00 = getTypeId(this,(this->accessChain).base);
  bVar1 = isPointerType(this,typeId_00);
  if (!bVar1) {
    __assert_fail("isPointerType(typeId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x5bb,"Id spv::Builder::getResultingAccessChainType() const");
  }
  local_14 = getContainedTypeId(this,typeId_00);
  local_18 = 0;
  do {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&(this->accessChain).indexChain);
    if ((int)sVar2 <= local_18) {
      return local_14;
    }
    bVar1 = isStructType(this,local_14);
    if (bVar1) {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&(this->accessChain).indexChain,(long)local_18);
      bVar1 = isConstantScalar(this,*pvVar3);
      if (!bVar1) {
        __assert_fail("isConstantScalar(accessChain.indexChain[i])",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0x5c0,"Id spv::Builder::getResultingAccessChainType() const");
      }
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&(this->accessChain).indexChain,(long)local_18);
      member = getConstantScalar(this,*pvVar3);
      local_14 = getContainedTypeId(this,local_14,member);
    }
    else {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&(this->accessChain).indexChain,(long)local_18);
      local_14 = getContainedTypeId(this,local_14,*pvVar3);
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

Id Builder::getResultingAccessChainType() const
{
    assert(accessChain.base != NoResult);
    Id typeId = getTypeId(accessChain.base);

    assert(isPointerType(typeId));
    typeId = getContainedTypeId(typeId);

    for (int i = 0; i < (int)accessChain.indexChain.size(); ++i) {
        if (isStructType(typeId)) {
            assert(isConstantScalar(accessChain.indexChain[i]));
            typeId = getContainedTypeId(typeId, getConstantScalar(accessChain.indexChain[i]));
        } else
            typeId = getContainedTypeId(typeId, accessChain.indexChain[i]);
    }

    return typeId;
}